

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_image *
rf_gen_image_checked_to_buffer
          (rf_image *__return_storage_ptr__,int width,int height,int checks_x,int checks_y,
          rf_color col1,rf_color col2,rf_color *dst,rf_int dst_size)

{
  int iVar1;
  undefined4 uStack_3c;
  long local_38;
  rf_int x;
  rf_int y;
  float center_y;
  float center_x;
  float radius;
  int checks_y_local;
  int checks_x_local;
  int height_local;
  int width_local;
  rf_color col1_local;
  
  memset(__return_storage_ptr__,0,0x18);
  iVar1 = rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8);
  if (width * height * iVar1 <= dst_size) {
    for (x = 0; x < height; x = x + 1) {
      for (local_38 = 0; local_38 < width; local_38 = local_38 + 1) {
        if ((local_38 / (long)checks_x + x / (long)checks_y) % 2 == 0) {
          dst[x * width + local_38] = col1;
        }
        else {
          dst[x * width + local_38] = col2;
        }
      }
    }
    __return_storage_ptr__->data = dst;
    __return_storage_ptr__->width = width;
    __return_storage_ptr__->height = height;
    __return_storage_ptr__->format = 7;
    __return_storage_ptr__->valid = true;
    *(undefined3 *)&__return_storage_ptr__->field_0x15 = uStack_3c._1_3_;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_gen_image_checked_to_buffer(int width, int height, int checks_x, int checks_y, rf_color col1, rf_color col2, rf_color* dst, rf_int dst_size)
{
    rf_image result = {0};

    if (dst_size >= width * height * rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8))
    {
        float radius = (width < height) ? ((float)width) / 2.0f : ((float)height) / 2.0f;

        float center_x = ((float)width ) / 2.0f;
        float center_y = ((float)height) / 2.0f;

        for (rf_int y = 0; y < height; y++)
        {
            for (rf_int x = 0; x < width; x++)
            {
                if ((x / checks_x + y / checks_y) % 2 == 0) dst[y * width + x] = col1;
                else dst[y * width + x] = col2;
            }
        }

        result = (rf_image)
        {
            .data = dst,
            .width = width,
            .height = height,
            .format = RF_UNCOMPRESSED_R8G8B8A8,
            .valid = true,
        };
    }

    return result;
}